

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void lsl_GvEw(PDISASM pMyDisasm)

{
  Int32 IVar1;
  int iVar2;
  Int32 i;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else {
    (pMyDisasm->Instruction).Category = 0xa0000;
    strcpy((pMyDisasm->Instruction).Mnemonic,"lsl");
    (pMyDisasm->Reserved_).MemDecoration = 0x66;
    IVar1 = (pMyDisasm->Reserved_).OperandSize;
    iVar2 = Security(2,pMyDisasm);
    if (iVar2 != 0) {
      (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
      if (((pMyDisasm->Reserved_).MOD_ == 3) && ((pMyDisasm->Reserved_).OperandSize == 0x40)) {
        (pMyDisasm->Reserved_).OperandSize = 0x20;
      }
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = IVar1;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      FillFlags(pMyDisasm,0x3e);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ lsl_GvEw(PDISASM pMyDisasm)
{
    Int32 i;
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }

    pMyDisasm->Instruction.Category = SYSTEM_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "lsl");
    #endif

    GV.MemDecoration = Arg2word;
    i = GV.OperandSize;
    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
    if ((GV.MOD_ == 0x3) && (GV.OperandSize == 64)){
      GV.OperandSize = 32;
    }
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    GV.OperandSize = i;
    decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
    GV.EIP_ += GV.DECALAGE_EIP+2;

    if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
      GV.ERROR_OPCODE = UD_;
    }
    FillFlags(pMyDisasm, 62);
}